

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O3

_Bool nni_aio_start(nni_aio *aio,nni_aio_cancel_fn cancel,void *data)

{
  _Bool _Var1;
  nni_aio_expire_q *mtx;
  ulong uVar2;
  nni_aio_expire_q *pnVar3;
  bool bVar4;
  nni_time nVar5;
  
  mtx = aio->a_expire_q;
  if ((aio->a_sleep == false) && ((aio->a_use_expire & 1U) == 0)) {
    if (aio->a_timeout + 2U < 2) {
      aio->a_expire = 0xffffffffffffffff;
    }
    else {
      bVar4 = true;
      if (aio->a_timeout == 0) goto LAB_001121bc;
      nVar5 = nni_clock();
      aio->a_expire = (long)aio->a_timeout + nVar5;
    }
  }
  else if ((aio->a_use_expire & 1U) != 0) {
    uVar2 = aio->a_expire;
    nVar5 = nni_clock();
    bVar4 = uVar2 <= nVar5;
    goto LAB_001121bc;
  }
  bVar4 = false;
LAB_001121bc:
  if (aio->a_sleep == false) {
    aio->a_expire_ok = false;
  }
  aio->a_result = NNG_OK;
  nni_task_prep(&aio->a_task);
  nni_mtx_lock(&mtx->eq_mtx);
  if (aio->a_stopped == true) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",0x176
              ,"!aio->a_stopped");
  }
  if ((aio->a_stop == false) && (mtx->eq_stop != true)) {
    if (aio->a_abort == true) {
      aio->a_sleep = false;
      aio->a_expire_ok = false;
      aio->a_abort = false;
      aio->a_count = 0;
      if (aio->a_result == NNG_OK) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",
                  0x187,"aio->a_result != NNG_OK");
      }
    }
    else {
      if (!bVar4) {
        if (aio->a_cancel_fn != (nni_aio_cancel_fn)0x0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c"
                    ,0x196,"aio->a_cancel_fn == NULL");
        }
        aio->a_cancel_fn = cancel;
        aio->a_cancel_arg = data;
        if ((cancel != (nni_aio_cancel_fn)0x0) && (aio->a_expire != 0xffffffffffffffff)) {
          pnVar3 = aio->a_expire_q;
          nni_list_append(&pnVar3->eq_list,aio);
          if (aio->a_expire < pnVar3->eq_next) {
            pnVar3->eq_next = aio->a_expire;
            nni_cv_wake(&pnVar3->eq_cv);
          }
        }
        nni_mtx_unlock(&mtx->eq_mtx);
        return true;
      }
      _Var1 = aio->a_expire_ok;
      aio->a_sleep = false;
      aio->a_expire_ok = false;
      aio->a_result = (_Var1 ^ 1) * 5;
      aio->a_count = 0;
    }
  }
  else {
    aio->a_stop = true;
    aio->a_sleep = false;
    aio->a_expire_ok = false;
    aio->a_count = 0;
    aio->a_result = NNG_ESTOPPED;
    aio->a_stopped = true;
  }
  nni_mtx_unlock(&mtx->eq_mtx);
  nni_task_dispatch(&aio->a_task);
  return false;
}

Assistant:

bool
nni_aio_start(nni_aio *aio, nni_aio_cancel_fn cancel, void *data)
{
	nni_aio_expire_q *eq      = aio->a_expire_q;
	bool              timeout = false;

	if (!aio->a_sleep && !aio->a_use_expire) {
		// Convert the relative timeout to an absolute timeout.
		switch (aio->a_timeout) {
		case NNG_DURATION_ZERO:
			timeout = true;
			break;
		case NNG_DURATION_INFINITE:
		case NNG_DURATION_DEFAULT:
			aio->a_expire = NNI_TIME_NEVER;
			break;
		default:
			aio->a_expire = nni_clock() + aio->a_timeout;
			break;
		}
	} else if (aio->a_use_expire && aio->a_expire <= nni_clock()) {
		timeout = true;
	}
	if (!aio->a_sleep) {
		aio->a_expire_ok = false;
	}
	aio->a_result = NNG_OK;

	// Do this outside the lock.  Note that we don't strictly need to have
	// done this for the failure cases below (the task framework does the
	// right thing if the task isn't prepped), but those should be uncommon
	// cases and doing this here avoids nesting the locks.
	nni_task_prep(&aio->a_task);

	nni_mtx_lock(&eq->eq_mtx);
	NNI_ASSERT(!aio->a_stopped);
	if (aio->a_stop || eq->eq_stop) {
		aio->a_stop      = true;
		aio->a_sleep     = false;
		aio->a_expire_ok = false;
		aio->a_count     = 0;
		aio->a_result    = NNG_ESTOPPED;
		aio->a_stopped   = true;
		nni_mtx_unlock(&eq->eq_mtx);
		nni_task_dispatch(&aio->a_task);
		return (false);
	}
	if (aio->a_abort) {
		aio->a_sleep     = false;
		aio->a_abort     = false;
		aio->a_expire_ok = false;
		aio->a_count     = 0;
		NNI_ASSERT(aio->a_result != NNG_OK);
		nni_mtx_unlock(&eq->eq_mtx);
		nni_task_dispatch(&aio->a_task);
		return (false);
	}
	if (timeout) {
		aio->a_sleep     = false;
		aio->a_result    = aio->a_expire_ok ? NNG_OK : NNG_ETIMEDOUT;
		aio->a_expire_ok = false;
		aio->a_count     = 0;
		nni_mtx_unlock(&eq->eq_mtx);
		nni_task_dispatch(&aio->a_task);
		return (false);
	}

	NNI_ASSERT(aio->a_cancel_fn == NULL);
	aio->a_cancel_fn  = cancel;
	aio->a_cancel_arg = data;

	// We only schedule expiration if we have a way for the expiration
	// handler to actively cancel it.
	if ((aio->a_expire != NNI_TIME_NEVER) && (cancel != NULL)) {
		nni_aio_expire_add(aio);
	}
	nni_mtx_unlock(&eq->eq_mtx);
	return (true);
}